

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_reader_utils.c
# Opt level: O0

uint32_t VP8GetValue(VP8BitReader *br,int bits)

{
  int iVar1;
  int in_ESI;
  undefined8 in_RDI;
  VP8BitReader *unaff_retaddr;
  uint32_t v;
  undefined4 local_10;
  undefined4 local_c;
  
  local_10 = 0;
  local_c = in_ESI;
  while (0 < local_c) {
    iVar1 = VP8GetBit(unaff_retaddr,(int)((ulong)in_RDI >> 0x20));
    local_10 = iVar1 << ((byte)(local_c + -1) & 0x1f) | local_10;
    local_c = local_c + -1;
  }
  return local_10;
}

Assistant:

uint32_t VP8GetValue(VP8BitReader* const br, int bits, const char label[]) {
  uint32_t v = 0;
  while (bits-- > 0) {
    v |= VP8GetBit(br, 0x80, label) << bits;
  }
  return v;
}